

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_dynamic_counter<double,(unsigned_char)2>::
serialize_map<std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair>,std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair>>>>
          (basic_dynamic_counter<double,(unsigned_char)2> *this,
          vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
          *value_map,string *str)

{
  double __val;
  pointer psVar1;
  element_type *v2;
  char *__s;
  pointer psVar2;
  string local_50;
  
  psVar1 = (value_map->
           super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (value_map->
                super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    v2 = (psVar2->
         super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
    __val = (v2->value).super___atomic_float<double>._M_fp;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (this + 0x10));
    __s = " ";
    if (*(long *)(this + 0x80) != *(long *)(this + 0x88)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (str,"{");
      build_string<std::array<std::__cxx11::string,2ul>>
                (this,str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(this + 0x80),&v2->label);
      __s = "} ";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(str,__s)
    ;
    std::__cxx11::to_string(&local_50,__val);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (str,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (str,"\n");
  }
  return;
}

Assistant:

void serialize_map(T &value_map, std::string &str) {
    for (auto &e : value_map) {
      auto &labels_value = e->label;
      auto val = e->value.load(std::memory_order::relaxed);
      str.append(Base::name_);
      if (Base::labels_name_.empty()) {
        str.append(" ");
      }
      else {
        str.append("{");
        build_string(str, Base::labels_name_, labels_value);
        str.append("} ");
      }

      str.append(std::to_string(val));

      str.append("\n");
    }
  }